

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

bool helics::apps::addPotentialTargetVariations
               (ConnectionsList *connections,string *interfaceName,string *targetFieldName1,
               string *targetFieldName2,json *interface)

{
  pointer pcVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  pcVar1 = (targetFieldName1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + targetFieldName1->_M_string_length);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_b0,"_");
  pbVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_b0,(targetFieldName2->_M_dataplus)._M_p,
                     targetFieldName2->_M_string_length);
  local_90._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar6 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar6) {
    local_90.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_90._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  bVar3 = addPotentialTargets(connections,interfaceName,&local_90,interface);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  paVar6 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar6) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    paVar6 = extraout_RAX;
  }
  if (!bVar3) {
    std::operator+(&local_50,targetFieldName1,targetFieldName2);
    bVar3 = addPotentialTargets(connections,interfaceName,&local_50,interface);
    paVar6 = &local_50.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar6) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      paVar6 = extraout_RAX_00;
    }
    if (!bVar3) {
      pcVar2 = (targetFieldName2->_M_dataplus)._M_p;
      iVar4 = toupper((int)*pcVar2);
      *pcVar2 = (char)iVar4;
      std::operator+(&local_70,targetFieldName1,targetFieldName2);
      addPotentialTargets(connections,interfaceName,&local_70,interface);
      paVar6 = &local_70.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar6) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        paVar6 = extraout_RAX_01;
      }
    }
  }
  return SUB81(paVar6,0);
}

Assistant:

static bool addPotentialTargetVariations(ConnectionsList& connections,
                                         const std::string& interfaceName,
                                         const std::string& targetFieldName1,
                                         std::string targetFieldName2,
                                         const nlohmann::json& interface)
{
    bool found = addPotentialTargets(connections,
                                     interfaceName,
                                     targetFieldName1 + "_" + targetFieldName2,
                                     interface);
    if (!found) {
        found = addPotentialTargets(connections,
                                    interfaceName,
                                    targetFieldName1 + targetFieldName2,
                                    interface);
    }
    if (!found) {
        targetFieldName2.front() = std::toupper(targetFieldName2.front());
        addPotentialTargets(connections,
                            interfaceName,
                            targetFieldName1 + targetFieldName2,
                            interface);
    }
    return found;
}